

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver_unix.cpp
# Opt level: O2

int __thiscall QLocalServerPrivate::listen(QLocalServerPrivate *this,int __fd,int __n)

{
  QObject *pQVar1;
  qsizetype qVar2;
  __mode_t __mode;
  Data *pDVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  parameter_type pQVar10;
  QSocketNotifier *this_00;
  int *piVar11;
  __mode_t _Var12;
  uint uVar13;
  undefined4 in_register_00000034;
  QString *pQVar14;
  char16_t *pcVar15;
  socklen_t __len;
  QStringBuilder<QString,_QLatin1String> *this_01;
  char16_t *pcVar16;
  undefined1 *puVar17;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QObject local_150 [8];
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<char16_t> local_130;
  undefined1 local_118 [24];
  QFileInfo serverNameFileInfo;
  QArrayDataPointer<char> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  _Storage<QTemporaryDir,_false> local_b8;
  undefined8 uStack_b0;
  QStringBuilder<QString,_QLatin1String> local_a8;
  undefined2 uStack_80;
  undefined8 uStack_7e;
  undefined8 local_76;
  undefined8 uStack_6e;
  undefined8 local_66;
  undefined8 uStack_5e;
  undefined8 local_56;
  undefined4 uStack_4e;
  undefined4 uStack_4a;
  undefined4 uStack_46;
  undefined8 uStack_42;
  long local_38;
  
  pQVar14 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  pQVar10 = QObjectBindableProperty<QLocalServerPrivate,_QFlags<QLocalServer::SocketOption>,_&QLocalServerPrivate::_qt_property_socketOptions_offset,_nullptr>
            ::value(&this->socketOptions);
  uVar9 = (pQVar10->super_QFlagsStorageHelper<QLocalServer::SocketOption,_4>).
          super_QFlagsStorage<QLocalServer::SocketOption>.i;
  uVar13 = 8;
  if ((uVar9 & 8) == 0) {
    uVar13 = uVar9;
  }
  if ((uVar13 & 8) == 0) {
    cVar7 = QString::startsWith((QChar)(char16_t)__fd,0x2f);
    if (cVar7 != '\0') goto LAB_0022719b;
    QDir::tempPath();
    QDir::cleanPath((QString *)&local_a8);
    pDVar3 = (this->fullServerName).d.d;
    pcVar16 = (this->fullServerName).d.ptr;
    (this->fullServerName).d.d = (Data *)CONCAT62(local_a8.a.d.d._2_6_,local_a8.a.d.d._0_2_);
    (this->fullServerName).d.ptr =
         (char16_t *)CONCAT62(local_a8.a.d.ptr._2_6_,local_a8.a.d.ptr._0_2_);
    local_a8.a.d.d._0_2_ = SUB82(pDVar3,0);
    local_a8.a.d.d._2_6_ = (undefined6)((ulong)pDVar3 >> 0x10);
    local_a8.a.d.ptr._0_2_ = (char16_t)pcVar16;
    local_a8.a.d.ptr._2_6_ = (undefined6)((ulong)pcVar16 >> 0x10);
    qVar2 = (this->fullServerName).d.size;
    (this->fullServerName).d.size = CONCAT62(local_a8.a.d.size._2_6_,(undefined2)local_a8.a.d.size);
    local_a8.a.d.size._0_2_ = (undefined2)qVar2;
    local_a8.a.d.size._2_6_ = (undefined6)((ulong)qVar2 >> 0x10);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    local_a8.a.d.d._0_2_ = 0x2f;
    local_a8.a.d.ptr._2_6_ = (undefined6)((ulong)pQVar14 >> 0x10);
    local_a8.a.d.ptr._0_2_ = (char16_t)__fd;
    ::operator+=(&this->fullServerName,(QStringBuilder<char16_t,_const_QString_&> *)&local_a8);
  }
  else {
LAB_0022719b:
    QString::operator=(&this->fullServerName,pQVar14);
  }
  QString::operator=(&this->serverName,pQVar14);
  local_d8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (char16_t *)0x0;
  local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit((QByteArray *)&local_f8,&this->fullServerName);
  local_b8 = (_Storage<QTemporaryDir,_false>)&DAT_aaaaaaaaaaaaaaaa;
  uStack_b0 = 0xaaaaaaaaaaaaaa00;
  if ((uVar13 & 7) == 0) {
    pcVar16 = (char16_t *)0x0;
    puVar17 = (undefined1 *)0x0;
LAB_00227459:
    iVar8 = ::socket(1,0x80001,0);
    qVar2 = local_f8.size;
    this->listenSocket = iVar8;
    if (iVar8 == -1) {
      this_01 = &local_a8;
    }
    else {
      local_a8.a.d.d._0_2_ = 1;
      local_a8.a.d.d._2_6_ = 0;
      local_a8.a.d.ptr._0_2_ = L'\0';
      local_a8.a.d.ptr._2_6_ = 0;
      local_a8.a.d.size._0_2_ = 0;
      local_a8.a.d.size._2_6_ = 0;
      local_a8.b.m_size._0_2_ = 0;
      local_a8.b.m_size._2_6_ = 0;
      local_a8.b.m_data._0_2_ = 0;
      local_a8.b.m_data._2_6_ = 0;
      uStack_80 = 0;
      uStack_7e = 0;
      local_76 = 0;
      uStack_6e = 0;
      local_66 = 0;
      uStack_5e = 0;
      local_56 = 0;
      uStack_4e = 0;
      uStack_4a = 0;
      uStack_46 = 0;
      uStack_42 = 0;
      if ((undefined1 *)0xffffffffffffff92 < (undefined1 *)(local_f8.size + -0x6b)) {
        if ((uVar13 & 8) == 0) {
          if ((uVar13 & 7) == 0) {
            pcVar15 = (char16_t *)local_f8.ptr;
            puVar17 = (undefined1 *)local_f8.size;
            if ((char16_t *)local_f8.ptr == (char16_t *)0x0) {
              pcVar15 = (char16_t *)&QByteArray::_empty;
            }
          }
          else {
            if (puVar17 + -0x6c < (undefined1 *)0xffffffffffffff93) goto LAB_002274cd;
            pcVar15 = pcVar16;
            if (pcVar16 == (char16_t *)0x0) {
              pcVar15 = (char16_t *)&QByteArray::_empty;
            }
          }
          __memcpy_chk((undefined1 *)((long)&local_a8.a.d.d + 2),pcVar15,puVar17 + 1,0x6c);
          __len = 0x6e;
        }
        else {
          pcVar15 = (char16_t *)local_f8.ptr;
          if ((char16_t *)local_f8.ptr == (char16_t *)0x0) {
            pcVar15 = (char16_t *)&QByteArray::_empty;
          }
          __memcpy_chk((undefined1 *)((long)&local_a8.a.d.d + 3),pcVar15,
                       (undefined1 *)(local_f8.size + 1),0x6b);
          __len = (int)qVar2 + 3;
        }
        iVar8 = bind(iVar8,(sockaddr *)&local_a8,__len);
        if (iVar8 == -1) {
          latin1_01.m_data = "QLocalServer::listen";
          latin1_01.m_size = 0x14;
          QString::QString((QString *)local_118,latin1_01);
          setError(this,(QString *)local_118);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
          piVar11 = __errno_location();
          if (*piVar11 == 0x62) {
            qt_safe_close(this->listenSocket);
          }
          else {
            closeServer(this);
          }
          this->listenSocket = -1;
          goto LAB_00227510;
        }
        iVar8 = ::listen(this->listenSocket,this->listenBacklog);
        if (iVar8 != -1) {
          if ((uVar13 & 7) == 0) {
LAB_00227683:
            this_00 = (QSocketNotifier *)operator_new(0x10);
            QSocketNotifier::QSocketNotifier(this_00,(long)this->listenSocket,Read,pQVar1);
            this->socketNotifier = this_00;
            QObject::connect(local_150,(char *)this_00,(QObject *)"2activated(QSocketDescriptor)",
                             (char *)pQVar1,0x261a76);
            QMetaObject::Connection::~Connection((Connection *)local_150);
            QSocketNotifier::setEnabled(SUB81(this->socketNotifier,0));
            iVar8 = (int)CONCAT71((int7)((ulong)this >> 8),1);
            goto LAB_00227512;
          }
          uVar9 = -(uVar13 & 1) & 0x1c0;
          _Var12 = uVar9 + 0x38;
          if ((uVar13 & 2) == 0) {
            _Var12 = uVar9;
          }
          __mode = _Var12 + 7;
          if ((uVar13 & 4) == 0) {
            __mode = _Var12;
          }
          if (pcVar16 == (char16_t *)0x0) {
            pcVar16 = (char16_t *)&QByteArray::_empty;
          }
          iVar8 = chmod((char *)pcVar16,__mode);
          if (iVar8 != -1) {
            pcVar15 = (char16_t *)local_f8.ptr;
            if ((char16_t *)local_f8.ptr == (char16_t *)0x0) {
              pcVar15 = (char16_t *)&QByteArray::_empty;
            }
            iVar8 = rename((char *)pcVar16,(char *)pcVar15);
            if (iVar8 != -1) goto LAB_00227683;
          }
        }
      }
LAB_002274cd:
      this_01 = (QStringBuilder<QString,_QLatin1String> *)local_118;
    }
    latin1_00.m_data = "QLocalServer::listen";
    latin1_00.m_size = 0x14;
    QString::QString(&this_01->a,latin1_00);
    setError(this,&this_01->a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
    closeServer(this);
  }
  else {
    _serverNameFileInfo = &DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&serverNameFileInfo,(QString *)&this->fullServerName);
    QFileInfo::absolutePath();
    uVar6 = local_118._16_8_;
    uVar5 = local_118._8_8_;
    uVar4 = local_118._0_8_;
    local_118._0_8_ = (Data *)0x0;
    local_118._8_8_ = (char16_t *)0x0;
    local_118._16_8_ = (undefined1 *)0x0;
    local_a8.a.d.d._0_2_ = (undefined2)uVar4;
    local_a8.a.d.d._2_6_ = SUB86(uVar4,2);
    local_a8.a.d.ptr._0_2_ = (char16_t)uVar5;
    local_a8.a.d.ptr._2_6_ = SUB86(uVar5,2);
    local_a8.a.d.size._0_2_ = (undefined2)uVar6;
    local_a8.a.d.size._2_6_ = SUB86(uVar6,2);
    local_a8.b.m_size._0_2_ = 0x2f;
    std::optional<QTemporaryDir>::emplace<QStringBuilder<QString,char16_t>>
              ((optional<QTemporaryDir> *)&local_b8._M_value,
               (QStringBuilder<QString,_char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_118);
    std::_Optional_base_impl<QTemporaryDir,_std::_Optional_base<QTemporaryDir,_false,_false>_>::
    _M_get((_Optional_base_impl<QTemporaryDir,_std::_Optional_base<QTemporaryDir,_false,_false>_> *)
           &local_b8._M_value);
    cVar7 = QTemporaryDir::isValid();
    if (cVar7 == '\0') {
      latin1.m_data = "QLocalServer::listen";
      latin1.m_size = 0x14;
      QString::QString(&local_a8.a,latin1);
      setError(this,&local_a8.a);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      pcVar16 = (char16_t *)0x0;
      puVar17 = (undefined1 *)0x0;
    }
    else {
      std::_Optional_base_impl<QTemporaryDir,_std::_Optional_base<QTemporaryDir,_false,_false>_>::
      _M_get((_Optional_base_impl<QTemporaryDir,_std::_Optional_base<QTemporaryDir,_false,_false>_>
              *)&local_b8._M_value);
      QTemporaryDir::path();
      qVar2 = local_148.size;
      pcVar16 = local_148.ptr;
      pDVar3 = local_148.d;
      local_148.d = (Data *)0x0;
      local_148.ptr = (char16_t *)0x0;
      local_a8.a.d.d._0_2_ = SUB82(pDVar3,0);
      local_a8.a.d.d._2_6_ = (undefined6)((ulong)pDVar3 >> 0x10);
      local_a8.a.d.ptr._0_2_ = (char16_t)pcVar16;
      local_a8.a.d.ptr._2_6_ = (undefined6)((ulong)pcVar16 >> 0x10);
      local_148.size = 0;
      local_a8.a.d.size._0_2_ = (undefined2)qVar2;
      local_a8.a.d.size._2_6_ = (undefined6)((ulong)qVar2 >> 0x10);
      local_a8.b.m_size._0_2_ = 2;
      local_a8.b.m_size._2_6_ = 0;
      local_a8.b.m_data._0_2_ = 0x1a55;
      local_a8.b.m_data._2_6_ = 0x26;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>((QString *)&local_130,&local_a8);
      QString::toLocal8Bit((QByteArray *)local_118,(QString *)&local_130);
      puVar17 = (undefined1 *)local_118._16_8_;
      pcVar16 = (char16_t *)local_118._8_8_;
      local_d8.d = (Data *)local_118._0_8_;
      local_118._0_8_ = (Data *)0x0;
      local_d8.ptr = (char16_t *)local_118._8_8_;
      local_118._8_8_ = (char16_t *)0x0;
      local_118._16_8_ = (undefined1 *)0x0;
      local_d8.size = (qsizetype)puVar17;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
    }
    QFileInfo::~QFileInfo(&serverNameFileInfo);
    if (cVar7 != '\0') goto LAB_00227459;
  }
LAB_00227510:
  iVar8 = 0;
LAB_00227512:
  std::_Optional_payload_base<QTemporaryDir>::_M_reset
            ((_Optional_payload_base<QTemporaryDir> *)&local_b8._M_value);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_f8);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

bool QLocalServerPrivate::listen(const QString &requestedServerName)
{
    Q_Q(QLocalServer);

    // socket options adjusted for current platform
    auto options = optionsForPlatform(socketOptions.value());

    // determine the full server path
    if (options.testFlag(QLocalServer::AbstractNamespaceOption)
        ||  requestedServerName.startsWith(u'/')) {
        fullServerName = requestedServerName;
    } else {
        fullServerName = QDir::cleanPath(QDir::tempPath());
        fullServerName += u'/' + requestedServerName;
    }
    serverName = requestedServerName;

    QByteArray encodedTempPath;
    const QByteArray encodedFullServerName = QFile::encodeName(fullServerName);
    std::optional<QTemporaryDir> tempDir;

    if (options & QLocalServer::WorldAccessOption) {
        QFileInfo serverNameFileInfo(fullServerName);
        tempDir.emplace(serverNameFileInfo.absolutePath() + u'/');
        if (!tempDir->isValid()) {
            setError("QLocalServer::listen"_L1);
            return false;
        }
        encodedTempPath = QFile::encodeName(tempDir->path() + "/s"_L1);
    }

    // create the unix socket
    listenSocket = qt_safe_socket(PF_UNIX, SOCK_STREAM, 0);
    if (-1 == listenSocket) {
        setError("QLocalServer::listen"_L1);
        closeServer();
        return false;
    }

    // Construct the unix address
    struct ::sockaddr_un addr;

    addr.sun_family = PF_UNIX;
    ::memset(addr.sun_path, 0, sizeof(addr.sun_path));

    // for abstract namespace add 2 to length, to take into account trailing AND leading null
    constexpr unsigned int extraCharacters = PlatformSupportsAbstractNamespace ? 2 : 1;

    if (sizeof(addr.sun_path) < static_cast<size_t>(encodedFullServerName.size() + extraCharacters)) {
        setError("QLocalServer::listen"_L1);
        closeServer();
        return false;
    }

    QT_SOCKLEN_T addrSize = sizeof(::sockaddr_un);
    if (options.testFlag(QLocalServer::AbstractNamespaceOption)) {
        // Abstract socket address is distinguished by the fact
        // that sun_path[0] is a null byte ('\0')
        ::memcpy(addr.sun_path + 1, encodedFullServerName.constData(),
                 encodedFullServerName.size() + 1);
        addrSize = offsetof(::sockaddr_un, sun_path) + encodedFullServerName.size() + 1;
    } else if (options & QLocalServer::WorldAccessOption) {
        if (sizeof(addr.sun_path) < static_cast<size_t>(encodedTempPath.size() + 1)) {
            setError("QLocalServer::listen"_L1);
            closeServer();
            return false;
        }
        ::memcpy(addr.sun_path, encodedTempPath.constData(),
                 encodedTempPath.size() + 1);
    } else {
        ::memcpy(addr.sun_path, encodedFullServerName.constData(),
                 encodedFullServerName.size() + 1);
    }

    // bind
    if (-1 == QT_SOCKET_BIND(listenSocket, (sockaddr *)&addr, addrSize)) {
        setError("QLocalServer::listen"_L1);
        // if address is in use already, just close the socket, but do not delete the file
        if (errno == EADDRINUSE)
            QT_CLOSE(listenSocket);
        // otherwise, close the socket and delete the file
        else
            closeServer();
        listenSocket = -1;
        return false;
    }

    // listen for connections
    if (-1 == qt_safe_listen(listenSocket, listenBacklog)) {
        setError("QLocalServer::listen"_L1);
        closeServer();
        return false;
    }

    if (options & QLocalServer::WorldAccessOption) {
        mode_t mode = 000;

        if (options & QLocalServer::UserAccessOption)
            mode |= S_IRWXU;

        if (options & QLocalServer::GroupAccessOption)
            mode |= S_IRWXG;

        if (options & QLocalServer::OtherAccessOption)
            mode |= S_IRWXO;

        if (::chmod(encodedTempPath.constData(), mode) == -1) {
            setError("QLocalServer::listen"_L1);
            closeServer();
            return false;
        }

        if (::rename(encodedTempPath.constData(), encodedFullServerName.constData()) == -1) {
            setError("QLocalServer::listen"_L1);
            closeServer();
            return false;
        }
    }

    Q_ASSERT(!socketNotifier);
    socketNotifier = new QSocketNotifier(listenSocket,
                                         QSocketNotifier::Read, q);
    q->connect(socketNotifier, SIGNAL(activated(QSocketDescriptor)),
               q, SLOT(_q_onNewConnection()));
    socketNotifier->setEnabled(maxPendingConnections > 0);
    return true;
}